

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O0

int run_test_udp_no_autobind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_1c0 [8];
  uv_udp_t h2;
  uv_udp_t h;
  uv_loop_t *loop;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,(uv_udp_t *)(h2.write_completed_queue + 1));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x7a,"0 == uv_udp_init(loop, &h)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)(h2.write_completed_queue + 1),0x20);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x7b,"UV_EBADF == uv_udp_set_multicast_ttl(&h, 32)");
    abort();
  }
  iVar1 = uv_udp_set_broadcast((uv_udp_t *)(h2.write_completed_queue + 1),1);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x7c,"UV_EBADF == uv_udp_set_broadcast(&h, 1)");
    abort();
  }
  iVar1 = uv_udp_set_ttl((uv_udp_t *)(h2.write_completed_queue + 1),1);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x80,"UV_EBADF == uv_udp_set_ttl(&h, 1)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_loop((uv_udp_t *)(h2.write_completed_queue + 1),1);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x82,"UV_EBADF == uv_udp_set_multicast_loop(&h, 1)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_interface((uv_udp_t *)(h2.write_completed_queue + 1),"0.0.0.0");
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x87,"UV_EBADF == uv_udp_set_multicast_interface(&h, \"0.0.0.0\")");
    abort();
  }
  uv_close((uv_handle_t *)(h2.write_completed_queue + 1),(uv_close_cb)0x0);
  iVar1 = uv_udp_init_ex(puVar2,(uv_udp_t *)local_1c0,0x102);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x8c,"0 == uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)local_1c0,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x8d,"0 == uv_udp_set_multicast_ttl(&h2, 32)");
    abort();
  }
  iVar1 = uv_udp_set_broadcast((uv_udp_t *)local_1c0,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x8e,"0 == uv_udp_set_broadcast(&h2, 1)");
    abort();
  }
  iVar1 = uv_udp_set_ttl((uv_udp_t *)local_1c0,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x94,"0 == uv_udp_set_ttl(&h2, 1)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_loop((uv_udp_t *)local_1c0,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x97,"0 == uv_udp_set_multicast_loop(&h2, 1)");
    abort();
  }
  iVar1 = uv_udp_set_multicast_interface((uv_udp_t *)local_1c0,"0.0.0.0");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x98,"0 == uv_udp_set_multicast_interface(&h2, \"0.0.0.0\")");
    abort();
  }
  uv_close((uv_handle_t *)local_1c0,(uv_close_cb)0x0);
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x9c,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
            ,0x9e,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT(0 == uv_udp_init(loop, &h));
  ASSERT(UV_EBADF == uv_udp_set_multicast_ttl(&h, 32));
  ASSERT(UV_EBADF == uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h, 1));
#else
  ASSERT(UV_EBADF == uv_udp_set_ttl(&h, 1));
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT(0 == uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT(0 == uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT(0 == uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h2, 1));
#else
  ASSERT(0 == uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT(0 == uv_udp_set_multicast_loop(&h2, 1));
  ASSERT(0 == uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}